

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LabelMaxSizeCase::iterate(LabelMaxSizeCase *this)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostringstream *poVar3;
  TestLog *pTVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 *puVar8;
  long *plVar9;
  NotSupportedError *this_00;
  TestError *this_01;
  size_type *psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  qpTestLog **ppqVar13;
  ulong *puVar14;
  undefined8 uVar15;
  qpTestLog *pqVar16;
  ulong uVar17;
  _Alloc_hider _Var18;
  int maxLabelLen;
  int outlen;
  vector<char,_std::allocator<char>_> readBuffer;
  ScopedLogSection section;
  vector<char,_std::allocator<char>_> buffer;
  ostringstream s;
  ResultCollector result;
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8;
  undefined8 uStack_2e0;
  int local_2d4;
  string local_2d0;
  qpTestLog **local_2b0;
  long local_2a8;
  qpTestLog *local_2a0;
  long lStack_298;
  string local_290;
  int local_26c;
  code *local_268;
  int local_260;
  undefined4 uStack_25c;
  ulong local_258 [2];
  undefined4 local_244;
  vector<char,_std::allocator<char>_> local_240;
  undefined8 local_228;
  ScopedLogSection local_220;
  vector<char,_std::allocator<char>_> local_218;
  undefined1 local_200 [112];
  ios_base local_190 [8];
  ios_base local_188 [264];
  ResultCollector local_80;
  long lVar7;
  
  bVar5 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar5) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x959);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar6);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_200 + 0x10);
  local_200._0_8_ = paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_80,pTVar4,(string *)local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._0_8_ != paVar2) {
    operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
  }
  local_2d4 = -1;
  local_26c = -1;
  (**(code **)(lVar7 + 0x868))(0x82e8);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  if (iVar6 != 0) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Got Error ","");
    local_268 = glu::getErrorName;
    local_260 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_268);
    pqVar16 = (qpTestLog *)0xf;
    if (local_2b0 != &local_2a0) {
      pqVar16 = local_2a0;
    }
    if (pqVar16 < (qpTestLog *)(local_290._M_string_length + local_2a8)) {
      uVar15 = (qpTestLog *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar15 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (qpTestLog *)(local_290._M_string_length + local_2a8)) goto LAB_0037f7c9;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0);
    }
    else {
LAB_0037f7c9:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar11) {
      local_200._16_8_ = paVar11->_M_allocated_capacity;
      local_200._24_8_ = plVar9[3];
      local_200._0_8_ = paVar2;
    }
    else {
      local_200._16_8_ = paVar11->_M_allocated_capacity;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_200._8_8_ = plVar9[1];
    *plVar9 = (long)paVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
  }
  local_200._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_200 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"GL_MAX_LABEL_LENGTH = ",0x16);
  std::ostream::operator<<(poVar3,local_2d4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_188);
  if (local_2d4 < 0x100) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    local_200._0_8_ = paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,"maxLabelLen was less than required (256)","");
    tcu::TestError::TestError(this_01,(string *)local_200);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (0x2000 < local_2d4) {
    local_200._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_200 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,
               "GL_MAX_LABEL_LENGTH is very large. Application having larger labels is unlikely, skipping test."
               ,0x5f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_188);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    goto LAB_00382485;
  }
  local_228 = (**(code **)(lVar7 + 0x640))(0x9117,0);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  if (iVar6 != 0) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Got Error ","");
    local_268 = glu::getErrorName;
    local_260 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_268);
    pqVar16 = (qpTestLog *)0xf;
    if (local_2b0 != &local_2a0) {
      pqVar16 = local_2a0;
    }
    if (pqVar16 < (qpTestLog *)(local_290._M_string_length + local_2a8)) {
      uVar15 = (qpTestLog *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar15 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (qpTestLog *)(local_290._M_string_length + local_2a8)) goto LAB_0037fb17;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0);
    }
    else {
LAB_0037fb17:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar11) {
      local_200._16_8_ = paVar11->_M_allocated_capacity;
      local_200._24_8_ = plVar9[3];
      local_200._0_8_ = paVar2;
    }
    else {
      local_200._16_8_ = paVar11->_M_allocated_capacity;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_200._8_8_ = plVar9[1];
    *plVar9 = (long)paVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
  }
  local_244 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  if (iVar6 != 0) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Got Error ","");
    local_268 = glu::getErrorName;
    local_260 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_268);
    pqVar16 = (qpTestLog *)0xf;
    if (local_2b0 != &local_2a0) {
      pqVar16 = local_2a0;
    }
    if (pqVar16 < (qpTestLog *)(local_290._M_string_length + local_2a8)) {
      uVar15 = (qpTestLog *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar15 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (qpTestLog *)(local_290._M_string_length + local_2a8)) goto LAB_0037fd6b;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0);
    }
    else {
LAB_0037fd6b:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar11) {
      local_200._16_8_ = paVar11->_M_allocated_capacity;
      local_200._24_8_ = plVar9[3];
      local_200._0_8_ = paVar2;
    }
    else {
      local_200._16_8_ = paVar11->_M_allocated_capacity;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_200._8_8_ = plVar9[1];
    *plVar9 = (long)paVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
  }
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_200._0_8_ = paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"Shader","");
  paVar11 = &local_2d0.field_2;
  local_2d0._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Shader object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_220,pTVar4,(string *)local_200,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar11) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._0_8_ != paVar2) {
    operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
  }
  local_200[0] = (string)0x58;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_218,(long)local_2d4,local_200,(allocator_type *)&local_2d0);
  local_200[0] = (string)0x58;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_240,(long)local_2d4,local_200,(allocator_type *)&local_2d0);
  local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [local_2d4 + -1] = '\0';
  local_200._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_200 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Setting max length label, with implicit size. (length = -1)",0x3b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_188);
  (**(code **)(lVar7 + 0xfc0))
            (0x82e1,local_244,0xffffffff,
             local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  if (iVar6 != 0) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Got Error ","");
    local_268 = glu::getErrorName;
    local_260 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_268);
    pqVar16 = (qpTestLog *)0xf;
    if (local_2b0 != &local_2a0) {
      pqVar16 = local_2a0;
    }
    if (pqVar16 < (qpTestLog *)(local_290._M_string_length + local_2a8)) {
      uVar15 = (qpTestLog *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar15 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (qpTestLog *)(local_290._M_string_length + local_2a8)) goto LAB_0038011d;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0);
    }
    else {
LAB_0038011d:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar12) {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._24_8_ = plVar9[3];
      local_200._0_8_ = paVar2;
    }
    else {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_200._8_8_ = plVar9[1];
    *plVar9 = (long)paVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
  }
  local_200._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_200 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Querying label back",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_188);
  local_26c = -1;
  (**(code **)(lVar7 + 0x958))
            (0x82e1,local_244,local_2d4,&local_26c,
             local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  if (iVar6 != 0) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Got Error ","");
    local_268 = glu::getErrorName;
    local_260 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_268);
    pqVar16 = (qpTestLog *)0xf;
    if (local_2b0 != &local_2a0) {
      pqVar16 = local_2a0;
    }
    if (pqVar16 < (qpTestLog *)(local_290._M_string_length + local_2a8)) {
      uVar15 = (qpTestLog *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar15 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (qpTestLog *)(local_290._M_string_length + local_2a8)) goto LAB_003803e6;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0);
    }
    else {
LAB_003803e6:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar12) {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._24_8_ = plVar9[3];
      local_200._0_8_ = paVar2;
    }
    else {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_200._8_8_ = plVar9[1];
    *plVar9 = (long)paVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
  }
  iVar6 = local_2d4 + -1;
  if (local_26c == iVar6) {
    if (local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[local_26c] != '\0') {
      local_200._0_8_ = paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"Buffer was not null-terminated","");
      tcu::ResultCollector::fail(&local_80,(string *)local_200);
      uVar15 = local_200._16_8_;
      _Var18._M_p = (pointer)local_200._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._0_8_ != paVar2) goto LAB_0038089e;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,iVar6);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,0x95f5bb);
    ppqVar13 = (qpTestLog **)(plVar9 + 2);
    if ((qpTestLog **)*plVar9 == ppqVar13) {
      local_2a0 = *ppqVar13;
      lStack_298 = plVar9[3];
      local_2b0 = &local_2a0;
    }
    else {
      local_2a0 = *ppqVar13;
      local_2b0 = (qpTestLog **)*plVar9;
    }
    local_2a8 = plVar9[1];
    *plVar9 = (long)ppqVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
      local_2f8 = &local_2e8;
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,local_26c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    uVar1 = CONCAT44(uStack_25c,local_260) + local_2f0;
    uVar17 = 0xf;
    if (local_2f8 != &local_2e8) {
      uVar17 = local_2e8;
    }
    if (uVar17 < uVar1) {
      uVar17 = 0xf;
      if (local_268 != (code *)local_258) {
        uVar17 = local_258[0];
      }
      if (uVar17 < uVar1) goto LAB_003807ad;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2f8);
    }
    else {
LAB_003807ad:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_268);
    }
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)psVar10 = 0;
    tcu::ResultCollector::fail(&local_80,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_268 != (code *)local_258) {
      operator_delete(local_268,local_258[0] + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
    uVar15 = local_290.field_2._M_allocated_capacity;
    _Var18._M_p = local_290._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
LAB_0038089e:
      operator_delete(_Var18._M_p,(ulong)((long)&((qpTestLog *)uVar15)->flags + 1));
    }
  }
  local_200._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_200 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Setting max length label, with explicit size. (length = ",0x38);
  std::ostream::operator<<(poVar3,local_2d4 + -1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_188);
  (**(code **)(lVar7 + 0xfc0))
            (0x82e1,local_244,local_2d4 + -1,
             local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  if (iVar6 != 0) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Got Error ","");
    local_268 = glu::getErrorName;
    local_260 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_268);
    pqVar16 = (qpTestLog *)0xf;
    if (local_2b0 != &local_2a0) {
      pqVar16 = local_2a0;
    }
    if (pqVar16 < (qpTestLog *)(local_290._M_string_length + local_2a8)) {
      uVar15 = (qpTestLog *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar15 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (qpTestLog *)(local_290._M_string_length + local_2a8)) goto LAB_003809de;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0);
    }
    else {
LAB_003809de:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar12) {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._24_8_ = plVar9[3];
      local_200._0_8_ = paVar2;
    }
    else {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_200._8_8_ = plVar9[1];
    *plVar9 = (long)paVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
  }
  local_200._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_200 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Querying label back",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_188);
  local_26c = -1;
  local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [local_2d4 + -1] = 'X';
  (**(code **)(lVar7 + 0x958))
            (0x82e1,local_244,local_2d4,&local_26c,
             local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  if (iVar6 != 0) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Got Error ","");
    local_268 = glu::getErrorName;
    local_260 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_268);
    pqVar16 = (qpTestLog *)0xf;
    if (local_2b0 != &local_2a0) {
      pqVar16 = local_2a0;
    }
    if (pqVar16 < (qpTestLog *)(local_290._M_string_length + local_2a8)) {
      uVar15 = (qpTestLog *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar15 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (qpTestLog *)(local_290._M_string_length + local_2a8)) goto LAB_00380cbb;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0);
    }
    else {
LAB_00380cbb:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar12) {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._24_8_ = plVar9[3];
      local_200._0_8_ = paVar2;
    }
    else {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_200._8_8_ = plVar9[1];
    *plVar9 = (long)paVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
  }
  iVar6 = local_2d4 + -1;
  if (local_26c == iVar6) {
    if (local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[local_26c] != '\0') {
      local_200._0_8_ = paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"Buffer was not null-terminated","");
      tcu::ResultCollector::fail(&local_80,(string *)local_200);
      uVar15 = local_200._16_8_;
      _Var18._M_p = (pointer)local_200._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._0_8_ != paVar2) goto LAB_00381173;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,iVar6);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,0x95f5bb);
    ppqVar13 = (qpTestLog **)(plVar9 + 2);
    if ((qpTestLog **)*plVar9 == ppqVar13) {
      local_2a0 = *ppqVar13;
      lStack_298 = plVar9[3];
      local_2b0 = &local_2a0;
    }
    else {
      local_2a0 = *ppqVar13;
      local_2b0 = (qpTestLog **)*plVar9;
    }
    local_2a8 = plVar9[1];
    *plVar9 = (long)ppqVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
      local_2f8 = &local_2e8;
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,local_26c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    uVar1 = CONCAT44(uStack_25c,local_260) + local_2f0;
    uVar17 = 0xf;
    if (local_2f8 != &local_2e8) {
      uVar17 = local_2e8;
    }
    if (uVar17 < uVar1) {
      uVar17 = 0xf;
      if (local_268 != (code *)local_258) {
        uVar17 = local_258[0];
      }
      if (uVar17 < uVar1) goto LAB_00381082;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2f8);
    }
    else {
LAB_00381082:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_268);
    }
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)psVar10 = 0;
    tcu::ResultCollector::fail(&local_80,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_268 != (code *)local_258) {
      operator_delete(local_268,local_258[0] + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
    uVar15 = local_290.field_2._M_allocated_capacity;
    _Var18._M_p = local_290._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
LAB_00381173:
      operator_delete(_Var18._M_p,(ulong)((long)&((qpTestLog *)uVar15)->flags + 1));
    }
  }
  if (local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::TestLog::endSection(local_220.m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_200._0_8_ = paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"Sync","");
  local_2d0._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Sync object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_220,pTVar4,(string *)local_200,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar11) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._0_8_ != paVar2) {
    operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
  }
  local_200[0] = (string)0x58;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_218,(long)local_2d4,local_200,(allocator_type *)&local_2d0);
  local_200[0] = (string)0x58;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_240,(long)local_2d4,local_200,(allocator_type *)&local_2d0);
  local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [local_2d4 + -1] = '\0';
  local_200._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_200 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Setting max length label, with implicit size. (length = -1)",0x3b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_188);
  (**(code **)(lVar7 + 0xfc8))
            (local_228,0xffffffff,
             local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  if (iVar6 != 0) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Got Error ","");
    local_268 = glu::getErrorName;
    local_260 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_268);
    pqVar16 = (qpTestLog *)0xf;
    if (local_2b0 != &local_2a0) {
      pqVar16 = local_2a0;
    }
    if (pqVar16 < (qpTestLog *)(local_290._M_string_length + local_2a8)) {
      uVar15 = (qpTestLog *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar15 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (qpTestLog *)(local_290._M_string_length + local_2a8)) goto LAB_003813bd;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0);
    }
    else {
LAB_003813bd:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar12) {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._24_8_ = plVar9[3];
      local_200._0_8_ = paVar2;
    }
    else {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_200._8_8_ = plVar9[1];
    *plVar9 = (long)paVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
  }
  local_200._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_200 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Querying label back",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_188);
  local_26c = -1;
  (**(code **)(lVar7 + 0x960))
            (local_228,local_2d4,&local_26c,
             local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  if (iVar6 != 0) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Got Error ","");
    local_268 = glu::getErrorName;
    local_260 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_268);
    pqVar16 = (qpTestLog *)0xf;
    if (local_2b0 != &local_2a0) {
      pqVar16 = local_2a0;
    }
    if (pqVar16 < (qpTestLog *)(local_290._M_string_length + local_2a8)) {
      uVar15 = (qpTestLog *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar15 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (qpTestLog *)(local_290._M_string_length + local_2a8)) goto LAB_00381682;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0);
    }
    else {
LAB_00381682:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar12) {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._24_8_ = plVar9[3];
      local_200._0_8_ = paVar2;
    }
    else {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_200._8_8_ = plVar9[1];
    *plVar9 = (long)paVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
  }
  iVar6 = local_2d4 + -1;
  if (local_26c == iVar6) {
    if (local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[local_26c] != '\0') {
      local_200._0_8_ = paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"Buffer was not null-terminated","");
      tcu::ResultCollector::fail(&local_80,(string *)local_200);
      uVar15 = local_200._16_8_;
      _Var18._M_p = (pointer)local_200._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._0_8_ != paVar2) goto LAB_00381b3a;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,iVar6);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,0x95f5bb);
    ppqVar13 = (qpTestLog **)(plVar9 + 2);
    if ((qpTestLog **)*plVar9 == ppqVar13) {
      local_2a0 = *ppqVar13;
      lStack_298 = plVar9[3];
      local_2b0 = &local_2a0;
    }
    else {
      local_2a0 = *ppqVar13;
      local_2b0 = (qpTestLog **)*plVar9;
    }
    local_2a8 = plVar9[1];
    *plVar9 = (long)ppqVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
      local_2f8 = &local_2e8;
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,local_26c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    uVar1 = CONCAT44(uStack_25c,local_260) + local_2f0;
    uVar17 = 0xf;
    if (local_2f8 != &local_2e8) {
      uVar17 = local_2e8;
    }
    if (uVar17 < uVar1) {
      uVar17 = 0xf;
      if (local_268 != (code *)local_258) {
        uVar17 = local_258[0];
      }
      if (uVar17 < uVar1) goto LAB_00381a49;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2f8);
    }
    else {
LAB_00381a49:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_268);
    }
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)psVar10 = 0;
    tcu::ResultCollector::fail(&local_80,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_268 != (code *)local_258) {
      operator_delete(local_268,local_258[0] + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
    uVar15 = local_290.field_2._M_allocated_capacity;
    _Var18._M_p = local_290._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
LAB_00381b3a:
      operator_delete(_Var18._M_p,(ulong)((long)&((qpTestLog *)uVar15)->flags + 1));
    }
  }
  local_200._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_200 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Setting max length label, with explicit size. (length = ",0x38);
  std::ostream::operator<<(poVar3,local_2d4 + -1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_188);
  (**(code **)(lVar7 + 0xfc8))
            (local_228,local_2d4 + -1,
             local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  if (iVar6 != 0) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Got Error ","");
    local_268 = glu::getErrorName;
    local_260 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_268);
    pqVar16 = (qpTestLog *)0xf;
    if (local_2b0 != &local_2a0) {
      pqVar16 = local_2a0;
    }
    if (pqVar16 < (qpTestLog *)(local_290._M_string_length + local_2a8)) {
      uVar15 = (qpTestLog *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar15 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (qpTestLog *)(local_290._M_string_length + local_2a8)) goto LAB_00381c76;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0);
    }
    else {
LAB_00381c76:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar12) {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._24_8_ = plVar9[3];
      local_200._0_8_ = paVar2;
    }
    else {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_200._8_8_ = plVar9[1];
    *plVar9 = (long)paVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
  }
  local_200._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_200 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Querying label back",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_188);
  local_26c = -1;
  local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [local_2d4 + -1] = 'X';
  (**(code **)(lVar7 + 0x960))
            (local_228,local_2d4,&local_26c,
             local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  if (iVar6 != 0) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Got Error ","");
    local_268 = glu::getErrorName;
    local_260 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_268);
    pqVar16 = (qpTestLog *)0xf;
    if (local_2b0 != &local_2a0) {
      pqVar16 = local_2a0;
    }
    if (pqVar16 < (qpTestLog *)(local_290._M_string_length + local_2a8)) {
      uVar15 = (qpTestLog *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar15 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (qpTestLog *)(local_290._M_string_length + local_2a8)) goto LAB_00381f4f;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0);
    }
    else {
LAB_00381f4f:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar12) {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._24_8_ = plVar9[3];
      local_200._0_8_ = paVar2;
    }
    else {
      local_200._16_8_ = paVar12->_M_allocated_capacity;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_200._8_8_ = plVar9[1];
    *plVar9 = (long)paVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)(local_290.field_2._M_allocated_capacity + 1));
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
  }
  iVar6 = local_2d4 + -1;
  if (local_26c == iVar6) {
    if (local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[local_26c] != '\0') {
      local_200._0_8_ = paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"Buffer was not null-terminated","");
      tcu::ResultCollector::fail(&local_80,(string *)local_200);
      local_290.field_2._M_allocated_capacity = local_200._16_8_;
      local_290._M_dataplus._M_p = (pointer)local_200._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._0_8_ != paVar2) goto LAB_00382408;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,iVar6);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,0x95f5bb);
    ppqVar13 = (qpTestLog **)(plVar9 + 2);
    if ((qpTestLog **)*plVar9 == ppqVar13) {
      local_2a0 = *ppqVar13;
      lStack_298 = plVar9[3];
      local_2b0 = &local_2a0;
    }
    else {
      local_2a0 = *ppqVar13;
      local_2b0 = (qpTestLog **)*plVar9;
    }
    local_2a8 = plVar9[1];
    *plVar9 = (long)ppqVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    puVar14 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar14) {
      local_2e8 = *puVar14;
      uStack_2e0 = puVar8[3];
      local_2f8 = &local_2e8;
    }
    else {
      local_2e8 = *puVar14;
      local_2f8 = (ulong *)*puVar8;
    }
    local_2f0 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,local_26c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    uVar1 = CONCAT44(uStack_25c,local_260) + local_2f0;
    uVar17 = 0xf;
    if (local_2f8 != &local_2e8) {
      uVar17 = local_2e8;
    }
    if (uVar17 < uVar1) {
      uVar17 = 0xf;
      if (local_268 != (code *)local_258) {
        uVar17 = local_258[0];
      }
      if (uVar17 < uVar1) goto LAB_00382317;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2f8);
    }
    else {
LAB_00382317:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_268);
    }
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = puVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_2d0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)psVar10 = 0;
    tcu::ResultCollector::fail(&local_80,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_268 != (code *)local_258) {
      operator_delete(local_268,local_258[0] + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,(ulong)((long)&local_2a0->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
LAB_00382408:
      operator_delete(local_290._M_dataplus._M_p,
                      (ulong)((long)&((qpTestLog *)local_290.field_2._M_allocated_capacity)->flags +
                             1));
    }
  }
  if (local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::TestLog::endSection(local_220.m_log);
  (**(code **)(lVar7 + 0x470))(local_244);
  (**(code **)(lVar7 + 0x478))(local_228);
  tcu::ResultCollector::setTestContextResult
            (&local_80,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
LAB_00382485:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

LabelMaxSizeCase::IterateResult LabelMaxSizeCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	int						maxLabelLen	= -1;
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;

	gl.getIntegerv(GL_MAX_LABEL_LENGTH, &maxLabelLen);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "GL_MAX_LABEL_LENGTH");

	m_testCtx.getLog() << TestLog::Message << "GL_MAX_LABEL_LENGTH = " << maxLabelLen << TestLog::EndMessage;

	if (maxLabelLen < 256)
		throw tcu::TestError("maxLabelLen was less than required (256)");
	if (maxLabelLen > 8192)
	{
		m_testCtx.getLog()
			<< TestLog::Message
			<< "GL_MAX_LABEL_LENGTH is very large. Application having larger labels is unlikely, skipping test."
			<< TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Shader", "Shader object");
		std::vector<char>			buffer		(maxLabelLen, 'X');
		std::vector<char>			readBuffer	(maxLabelLen, 'X');

		buffer[maxLabelLen-1] = '\0';

		m_testCtx.getLog() << TestLog::Message << "Setting max length label, with implicit size. (length = -1)" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, -1,  &buffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label back" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectLabel(GL_SHADER, shader, maxLabelLen, &outlen, &readBuffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != maxLabelLen-1)
			result.fail("'length' was not " + de::toString(maxLabelLen-1) + ", got " + de::toString(outlen));
		else if (readBuffer[outlen] != '\0')
			result.fail("Buffer was not null-terminated");

		m_testCtx.getLog() << TestLog::Message << "Setting max length label, with explicit size. (length = " << (maxLabelLen-1) << ")" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, maxLabelLen-1,  &buffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label back" << TestLog::EndMessage;
		outlen = -1;
		readBuffer[maxLabelLen-1] = 'X';
		gl.getObjectLabel(GL_SHADER, shader, maxLabelLen, &outlen, &readBuffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != maxLabelLen-1)
			result.fail("'length' was not " + de::toString(maxLabelLen-1) + ", got " + de::toString(outlen));
		else if (readBuffer[outlen] != '\0')
			result.fail("Buffer was not null-terminated");
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "Sync", "Sync object");
		std::vector<char>			buffer		(maxLabelLen, 'X');
		std::vector<char>			readBuffer	(maxLabelLen, 'X');

		buffer[maxLabelLen-1] = '\0';

		m_testCtx.getLog() << TestLog::Message << "Setting max length label, with implicit size. (length = -1)" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, -1,  &buffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label back" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectPtrLabel(sync, maxLabelLen, &outlen, &readBuffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != maxLabelLen-1)
			result.fail("'length' was not " + de::toString(maxLabelLen-1) + ", got " + de::toString(outlen));
		else if (readBuffer[outlen] != '\0')
			result.fail("Buffer was not null-terminated");

		m_testCtx.getLog() << TestLog::Message << "Setting max length label, with explicit size. (length = " << (maxLabelLen-1) << ")" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, maxLabelLen-1,  &buffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label back" << TestLog::EndMessage;
		outlen = -1;
		readBuffer[maxLabelLen-1] = 'X';
		gl.getObjectPtrLabel(sync, maxLabelLen, &outlen, &readBuffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != maxLabelLen-1)
			result.fail("'length' was not " + de::toString(maxLabelLen-1) + ", got " + de::toString(outlen));
		else if (readBuffer[outlen] != '\0')
			result.fail("Buffer was not null-terminated");
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}